

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

pair<bool,_unsigned_long> __thiscall
IdentifierTokenizerRule::tryMatch(IdentifierTokenizerRule *this,shared_ptr<Readable> *reader)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  unsigned_long extraout_RAX;
  pair<bool,_unsigned_long> pVar5;
  bool local_41;
  int local_40;
  bool local_39;
  pair<bool,_int> local_38;
  unsigned_long local_30;
  size_t i;
  shared_ptr<Readable> *reader_local;
  IdentifierTokenizerRule *this_local;
  unsigned_long local_10;
  unsigned_long uVar4;
  
  local_30 = 0;
  i = (size_t)reader;
  reader_local = (shared_ptr<Readable> *)this;
  peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      reader);
  iVar2 = (*peVar3->_vptr_Readable[2])(peVar3,local_30);
  bVar1 = isLiteralFirst((char)iVar2);
  if (bVar1) {
    do {
      local_30 = local_30 + 1;
      peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )reader);
      iVar2 = (*peVar3->_vptr_Readable[2])(peVar3,local_30);
      if ((char)iVar2 == '\0') break;
      peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )reader);
      iVar2 = (*peVar3->_vptr_Readable[2])(peVar3,local_30);
      bVar1 = isLiteralRest((char)iVar2);
    } while (bVar1);
    local_41 = true;
    pVar5 = std::make_pair<bool,unsigned_long&>(&local_41,&local_30);
    uVar4 = pVar5.second;
    this_local._0_1_ = pVar5.first;
    local_10 = uVar4;
  }
  else {
    local_39 = false;
    local_40 = 0;
    local_38 = std::make_pair<bool,int>(&local_39,&local_40);
    std::pair<bool,_unsigned_long>::pair<bool,_int,_true>
              ((pair<bool,_unsigned_long> *)&this_local,&local_38);
    uVar4 = extraout_RAX;
  }
  pVar5._1_7_ = (undefined7)(uVar4 >> 8);
  pVar5.first = (bool)this_local._0_1_;
  pVar5.second = local_10;
  return pVar5;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    std::size_t i = 0;

    if (!isLiteralFirst(reader->charAt(i))) {
      return std::make_pair(false, 0);
    }

    i++;

    for (; reader->charAt(i) != '\0'; i++) {
      if (!isLiteralRest(reader->charAt(i))) {
        break;
      }
    }

    return std::make_pair(true, i);
  }